

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void usage(void)

{
  printf("Pageant: SSH agent\n");
  printf("%s\n","Unidentified build");
  printf("Usage: pageant <lifetime> [[--encrypted] key files]\n");
  printf("       pageant [[--encrypted] key files] --exec <command> [args]\n");
  printf("       pageant -a [--encrypted] [key files]\n");
  printf("       pageant -d [key identifiers]\n");
  printf("       pageant -D\n");
  printf("       pageant -r [key identifiers]\n");
  printf("       pageant -R\n");
  printf("       pageant --public [key identifiers]\n");
  printf("       pageant ( --public-openssh | -L ) [key identifiers]\n");
  printf("       pageant -l [-E fptype]\n");
  printf("Lifetime options, for running Pageant as an agent:\n");
  printf("  -X           run with the lifetime of the X server\n");
  printf("  -T           run with the lifetime of the controlling tty\n");
  printf("  --permanent  run permanently\n");
  printf("  --debug      run in debugging mode, without forking\n");
  printf("  --exec <command>   run with the lifetime of that command\n");
  printf("Client options, for talking to an existing agent:\n");
  printf("  -a           add key(s) to the existing agent\n");
  printf("  -l           list currently loaded key fingerprints and comments\n");
  printf("  --public     print public keys in RFC 4716 format\n");
  printf("  --public-openssh, -L   print public keys in OpenSSH format\n");
  printf("  -d           delete key(s) from the agent\n");
  printf("  -D           delete all keys from the agent\n");
  printf("  -r           re-encrypt keys in the agent (forget cleartext)\n");
  printf("  -R           re-encrypt all possible keys in the agent\n");
  printf("Other options:\n");
  printf("  -v           verbose mode (in agent mode)\n");
  printf("  -s -c        force POSIX or C shell syntax (in agent mode)\n");
  printf("  --symlink path   create symlink to socket (in agent mode)\n");
  printf("  --encrypted  when adding keys, don\'t decrypt\n");
  printf("  -E alg, --fptype alg   fingerprint type for -l (sha256, md5)\n");
  printf("  --tty-prompt force tty-based passphrase prompt\n");
  printf("  --gui-prompt force GUI-based passphrase prompt\n");
  printf("  --askpass <prompt>   behave like a standalone askpass program\n");
  exit(1);
}

Assistant:

static void usage(void)
{
    printf("Pageant: SSH agent\n");
    printf("%s\n", ver);
    printf("Usage: pageant <lifetime> [[--encrypted] key files]\n");
    printf("       pageant [[--encrypted] key files] --exec <command> [args]\n");
    printf("       pageant -a [--encrypted] [key files]\n");
    printf("       pageant -d [key identifiers]\n");
    printf("       pageant -D\n");
    printf("       pageant -r [key identifiers]\n");
    printf("       pageant -R\n");
    printf("       pageant --public [key identifiers]\n");
    printf("       pageant ( --public-openssh | -L ) [key identifiers]\n");
    printf("       pageant -l [-E fptype]\n");
    printf("Lifetime options, for running Pageant as an agent:\n");
    printf("  -X           run with the lifetime of the X server\n");
    printf("  -T           run with the lifetime of the controlling tty\n");
    printf("  --permanent  run permanently\n");
    printf("  --debug      run in debugging mode, without forking\n");
    printf("  --exec <command>   run with the lifetime of that command\n");
    printf("Client options, for talking to an existing agent:\n");
    printf("  -a           add key(s) to the existing agent\n");
    printf("  -l           list currently loaded key fingerprints and comments\n");
    printf("  --public     print public keys in RFC 4716 format\n");
    printf("  --public-openssh, -L   print public keys in OpenSSH format\n");
    printf("  -d           delete key(s) from the agent\n");
    printf("  -D           delete all keys from the agent\n");
    printf("  -r           re-encrypt keys in the agent (forget cleartext)\n");
    printf("  -R           re-encrypt all possible keys in the agent\n");
    printf("Other options:\n");
    printf("  -v           verbose mode (in agent mode)\n");
    printf("  -s -c        force POSIX or C shell syntax (in agent mode)\n");
    printf("  --symlink path   create symlink to socket (in agent mode)\n");
    printf("  --encrypted  when adding keys, don't decrypt\n");
    printf("  -E alg, --fptype alg   fingerprint type for -l (sha256, md5)\n");
    printf("  --tty-prompt force tty-based passphrase prompt\n");
    printf("  --gui-prompt force GUI-based passphrase prompt\n");
    printf("  --askpass <prompt>   behave like a standalone askpass program\n");
    exit(1);
}